

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clean.c
# Opt level: O0

void StripOnlyChild(TidyDocImpl *doc,Node *node)

{
  Node *node_00;
  Node *local_20;
  Node *child;
  Node *node_local;
  TidyDocImpl *doc_local;
  
  node_00 = node->content;
  node->content = node_00->content;
  node->last = node_00->last;
  node_00->content = (Node *)0x0;
  prvTidyFreeNode(doc,node_00);
  for (local_20 = node->content; local_20 != (Node *)0x0; local_20 = local_20->next) {
    local_20->parent = node;
  }
  return;
}

Assistant:

static void StripOnlyChild(TidyDocImpl* doc, Node *node)
{
    Node *child;

    child = node->content;
    node->content = child->content;
    node->last = child->last;
    child->content = NULL;
    TY_(FreeNode)(doc, child);

    for (child = node->content; child; child = child->next)
        child->parent = node;
}